

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O3

void __thiscall HinOut::compareData(HinOut *this,int lvl)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  pointer piVar5;
  int iVar6;
  ostream *poVar7;
  iterator iVar8;
  undefined8 *puVar9;
  pair<int,_double> *ppVar10;
  long lVar11;
  ulong uVar12;
  pointer piVar13;
  pair<int,_double> *ppVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> columnA;
  pair<int,_double> p;
  pair<int,_double> *local_68;
  iterator iStack_60;
  pair<int,_double> *local_58;
  pair<int,_double> local_48;
  long local_38;
  
  if ((this->super_HPreData).numCol != this->onumCol) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Column counts differ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  if ((this->super_HPreData).numRow != this->onumRow) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Row counts differ",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  if (this->AcountX != this->oAcountX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AcountX counts differ",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  iVar6 = (this->super_HPreData).numCol;
  lVar16 = 0;
  if (0 < iVar6) {
    do {
      piVar13 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar13[lVar16 + 1] - piVar13[lVar16] != piVar5[lVar16 + 1] - piVar5[lVar16]) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"col length different: col[",0x1a);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
        iVar6 = (this->super_HPreData).numCol;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar6);
  }
  std::ostream::flush();
  if ((this->super_HPreData).numCol < 1) {
    if (lvl < 1) {
      return;
    }
  }
  else {
    local_38 = lVar16 << 4;
    lVar16 = 0;
    do {
      local_68 = (pair<int,_double> *)0x0;
      iStack_60._M_current = (pair<int,_double> *)0x0;
      local_58 = (pair<int,_double> *)0x0;
      piVar13 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar6 = piVar13[lVar16];
      lVar17 = (long)iVar6;
      lVar1 = lVar16 + 1;
      if (iVar6 < piVar13[lVar16 + 1]) {
        do {
          local_48.first =
               (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar17];
          local_48.second =
               (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar17];
          if (iStack_60._M_current == local_58) {
            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
            _M_realloc_insert<std::pair<int,double>const&>
                      ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                       &local_68,iStack_60,&local_48);
          }
          else {
            *(ulong *)iStack_60._M_current = CONCAT44(local_48._4_4_,local_48.first);
            (iStack_60._M_current)->second = local_48.second;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < (this->super_HPreData).Astart.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar1]);
      }
      piVar13 = (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar17 = (long)piVar13[lVar16];
      iVar8._M_current = iStack_60._M_current;
      ppVar10 = local_68;
      ppVar14 = local_68;
      if (piVar13[lVar16] < piVar13[lVar1]) {
        do {
          if (iVar8._M_current != ppVar10) {
            lVar15 = 0x18;
            uVar18 = 0;
            do {
              if (ppVar10[uVar18].first ==
                  (this->oAindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar17]) {
                pdVar2 = (this->oAvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start + lVar17;
                if ((ppVar10[uVar18].second != *pdVar2) ||
                   (NAN(ppVar10[uVar18].second) || NAN(*pdVar2))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"mismatch in row ",0x10);
                  poVar7 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)&std::cout,
                                      (this->super_HPreData).Aindex.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar17]);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7," col ",5);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)lVar16);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7," in Avalue: ",0xc);
                  poVar7 = std::ostream::_M_insert<double>
                                     (*(double *)((long)&local_68->second + local_38));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7," in oAvalue: ",0xd);
                  poVar7 = std::ostream::_M_insert<double>
                                     ((this->oAvalue).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar17]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                  std::ostream::put((char)poVar7);
                  std::ostream::flush();
                  iVar8._M_current = iStack_60._M_current;
                  ppVar14 = local_68;
                }
                else {
                  if ((ppVar10 + uVar18 + 1 != iVar8._M_current) &&
                     (lVar11 = (long)iVar8._M_current - (long)(ppVar10 + uVar18 + 1) >> 4,
                     0 < lVar11)) {
                    uVar12 = lVar11 + 1;
                    puVar9 = (undefined8 *)((long)&ppVar10->first + lVar15);
                    do {
                      *(undefined4 *)(puVar9 + -3) = *(undefined4 *)(puVar9 + -1);
                      puVar9[-2] = *puVar9;
                      uVar12 = uVar12 - 1;
                      puVar9 = puVar9 + 2;
                    } while (1 < uVar12);
                  }
                  iStack_60._M_current = iVar8._M_current + -1;
                  iVar8._M_current = iStack_60._M_current;
                }
              }
              ppVar10 = ppVar14;
              uVar18 = uVar18 + 1;
              lVar15 = lVar15 + 0x10;
              ppVar14 = ppVar10;
            } while (uVar18 < (ulong)((long)iVar8._M_current - (long)ppVar10 >> 4));
            piVar13 = (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < piVar13[lVar1]);
      }
      if (ppVar14 != (pair<int,_double> *)0x0) {
        operator_delete(ppVar14);
      }
      iVar6 = (this->super_HPreData).numCol;
      lVar16 = lVar1;
    } while (lVar1 < iVar6);
    if (lvl < 1) {
      return;
    }
    if (0 < iVar6) {
      lVar16 = 0;
      do {
        dVar3 = (this->super_HPreData).colCost.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar16];
        dVar4 = (this->ocolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar16];
        dVar20 = ABS(dVar3);
        dVar19 = 1.0;
        if ((1.0 < dVar20) && (dVar19 = ABS(dVar4), dVar19 <= dVar20)) {
          dVar19 = dVar20;
        }
        dVar19 = ABS(dVar3 - dVar4) / dVar19;
        iVar6 = (int)lVar16;
        if ((1e-08 < dVar19) && ((dVar19 != 0.0 || (NAN(dVar19))))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"colCost[",8);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        }
        dVar3 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar16];
        dVar4 = (this->ocolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar16];
        dVar20 = ABS(dVar3);
        dVar19 = 1.0;
        if ((1.0 < dVar20) && (dVar19 = ABS(dVar4), dVar19 <= dVar20)) {
          dVar19 = dVar20;
        }
        dVar19 = ABS(dVar3 - dVar4) / dVar19;
        if ((1e-08 < dVar19) && ((dVar19 != 0.0 || (NAN(dVar19))))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"colLower[",9);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        }
        dVar3 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar16];
        dVar4 = (this->ocolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar16];
        dVar20 = ABS(dVar3);
        dVar19 = 1.0;
        if ((1.0 < dVar20) && (dVar19 = ABS(dVar4), dVar19 <= dVar20)) {
          dVar19 = dVar20;
        }
        dVar19 = ABS(dVar3 - dVar4) / dVar19;
        if ((1e-08 < dVar19) && ((dVar19 != 0.0 || (NAN(dVar19))))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"colUpper[",9);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (this->super_HPreData).numCol);
    }
  }
  if ((lvl != 1) && (0 < (this->super_HPreData).numRow)) {
    lVar16 = 0;
    do {
      dVar3 = (this->super_HPreData).rowLower.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar16];
      dVar4 = (this->orowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16];
      dVar20 = ABS(dVar3);
      dVar19 = 1.0;
      if ((1.0 < dVar20) && (dVar19 = ABS(dVar4), dVar19 <= dVar20)) {
        dVar19 = dVar20;
      }
      dVar19 = ABS(dVar3 - dVar4) / dVar19;
      if ((1e-08 < dVar19) && ((dVar19 != 0.0 || (NAN(dVar19))))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rowLower[",9);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
      }
      dVar3 = (this->super_HPreData).rowUpper.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar16];
      dVar4 = (this->orowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16];
      dVar20 = ABS(dVar3);
      dVar19 = 1.0;
      if ((1.0 < dVar20) && (dVar19 = ABS(dVar4), dVar19 <= dVar20)) {
        dVar19 = dVar20;
      }
      dVar19 = ABS(dVar3 - dVar4) / dVar19;
      if ((1e-08 < dVar19) && ((dVar19 != 0.0 || (NAN(dVar19))))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rowUpper[",9);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (this->super_HPreData).numRow);
  }
  return;
}

Assistant:

void HinOut::compareData(int lvl) {
	int i;
	if (numCol != onumCol)
		cout <<"Column counts differ"<<endl;

	if (numRow != onumRow)
		cout <<"Row counts differ"<<endl;

	if (AcountX != oAcountX)
		cout <<"AcountX counts differ"<<endl;


	//matrix
	for (i=0; i<numCol; i++)
		if (Astart[i+1]-Astart[i] != oAstart[i+1]-oAstart[i])
			cout<<"col length different: col["<<i<<"]\n";

	cout<<flush;

//
//	for (i=0; i<AcountX; i++)
//		if (Aindex[i] != oAindex[i])
//			cout<<"Aindex["<<i<<"]";
//
//	for (i=0; i<AcountX; i++)
//		if (getdiff(Avalue[i] , oAvalue[i]))
//			cout<<"Avalue["<<i<<"]";

	//Aindex and Avalue can differ in their order:
	for (int j=0; j<numCol; j++) {
		vector<pair<int, double>> columnA, columnOA;
		for (int k=Astart[j]; k<Astart[j+1]; k++) {
			pair<int, double> p(Aindex[k], Avalue[k]);
			columnA.push_back(p);
		}

		for (int k=oAstart[j]; k<oAstart[j+1]; k++) {
			//pair<int, double> p(oAindex[k], oAvalue[k]);
			for (size_t l=0;l < columnA.size(); l++)
				if (get<0>(columnA[l])==oAindex[k]) {
					if (get<1>(columnA[l])==oAvalue[k]) {
						columnA.erase(columnA.begin() + l);
						continue;
					}
					else {
						cout<<"mismatch in row "<<Aindex[k]<<" col "<<j<< " in Avalue: "<< get<1>(columnA[i]) << " in oAvalue: "<< oAvalue[k] <<endl;
					}
				}
			//columnOA.push_back(p);
		}
	}






	if (lvl > 0) {


	for (i=0; i<numCol; i++) {
		if (getdiff(colCost[i] , ocolCost[i]))
			cout<<"colCost["<<i<<"]";
		if (getdiff(colLower[i] , ocolLower[i]))
			cout<<"colLower["<<i<<"]";
		if (getdiff(colUpper[i] , ocolUpper[i]))
			cout<<"colUpper["<<i<<"]";

	}

	}
	if (lvl>1) {


	for (i=0; i<numRow; i++) {
		if (getdiff(rowLower[i] , orowLower[i]))
			cout<<"rowLower["<<i<<"]";
		if (getdiff(rowUpper[i] , orowUpper[i]))
			cout<<"rowUpper["<<i<<"]";
	}

	}

}